

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O1

Node verona::append_fq(Node *fq,Node *node)

{
  _Rb_tree_header *p_Var1;
  size_type *psVar2;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined8 uVar7;
  element_type *this;
  undefined8 uVar8;
  undefined8 uVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  Token *pTVar11;
  WFLookup *pWVar12;
  int iVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  long *in_RDX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  void *__child_stack_02;
  void *__child_stack_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_29;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  NodeDef *pNVar16;
  void *in_R8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Node NVar17;
  Node local_1b0;
  WFLookup local_1a0;
  undefined1 *local_180;
  WFLookup local_178;
  undefined1 local_158 [24];
  element_type *peStack_140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  undefined1 local_128 [24];
  NodeDef *pNStack_110;
  undefined1 local_108 [24];
  element_type *peStack_f0;
  undefined1 local_e8 [24];
  element_type *peStack_d0;
  undefined1 local_c8 [16];
  WFLookup local_b8;
  WFLookup local_98;
  WFLookup local_78;
  Token local_58;
  Token local_50;
  Token local_48;
  Token local_40;
  Token local_38;
  
  p_Var4 = &local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  local_1a0.wf = (Wellformed *)FQType;
  local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)FQFunction;
  pTVar11 = ::std::
            __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                      (&local_1a0,p_Var4,
                       &((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->type_);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pTVar11 == p_Var4) {
    __assert_fail("fq->type().in({FQType, FQFunction})",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                  ,0x1a0,"Node verona::append_fq(Node, Node)");
  }
  local_1a0.wf = (Wellformed *)TypeClassName;
  local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&TypeAliasName;
  local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)TypeParamName;
  local_1a0.index = (size_t)TypeTraitName;
  local_180 = Selector;
  pWVar12 = (WFLookup *)
            ::std::
            __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                      (&local_1a0,&local_178,*in_RDX + 0x10);
  if (pWVar12 == &local_178) {
    __assert_fail("node->in( {TypeClassName, TypeAliasName, TypeParamName, TypeTraitName, Selector})"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                  ,0x1a2,"Node verona::append_fq(Node, Node)");
  }
  if ((((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_).def
      == (TokenDef *)FQFunction) {
    iVar13 = 0x2dd288;
    if (*(undefined1 **)(*in_RDX + 0x10) == Selector) {
      __assert_fail("node != Selector",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                    ,0x1a7,"Node verona::append_fq(Node, Node)");
    }
    local_1a0.wf = (Wellformed *)FQType;
    trieste::NodeDef::create((NodeDef *)local_108,(Token *)&local_1a0);
    local_38.def = (TokenDef *)FQType;
    trieste::operator/(&local_98,node,&local_38);
    local_40.def = (TokenDef *)TypePath;
    trieste::wf::detail::WFLookup::operator/(&local_1a0,&local_98,&local_40);
    if (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_130 = local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      local_158._16_8_ = (NodeDef *)0x0;
      peStack_140 = (element_type *)0x0;
    }
    else {
      trieste::NodeDef::clone
                ((NodeDef *)(local_158 + 0x10),
                 (__fn *)local_1a0.node.
                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 __child_stack_00,iVar13,in_R8);
    }
    local_48.def = (TokenDef *)FQType;
    trieste::operator/(&local_78,node,&local_48);
    local_50.def = (TokenDef *)Type;
    trieste::wf::detail::WFLookup::operator/(&local_178,&local_78,&local_50);
    _Var6._M_pi = local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    if (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      local_c8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_c8._8_8_ = (NodeDef *)0x0;
    }
    else {
      trieste::NodeDef::clone
                ((NodeDef *)local_c8,
                 (__fn *)local_178.node.
                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 __child_stack_02,iVar13,in_R8);
    }
    local_b8.wf = (Wellformed *)local_c8._0_8_;
    local_b8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_c8._8_8_;
    p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_;
    if ((NodeDef *)local_c8._8_8_ != (NodeDef *)0x0) {
      p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 8))->_M_pi =
             *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 8))->_M_pi + 1;
        UNLOCK();
      }
      else {
        *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 8))->_M_pi =
             *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8._8_8_ + 8))->_M_pi + 1;
      }
    }
    iVar13 = (int)p_Var14;
    trieste::NodeDef::push_back((NodeDef *)local_158._16_8_,(Node *)(local_c8 + 0x10));
    if (local_b8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (NodeDef *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_b8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    this = peStack_140;
    uVar7 = local_158._16_8_;
    local_158._16_8_ = (NodeDef *)0x0;
    peStack_140 = (element_type *)0x0;
    local_58.def = (TokenDef *)Selector;
    trieste::operator/((WFLookup *)(local_c8 + 0x10),node,&local_58);
    _Var10._M_pi = local_b8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_b8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_b8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_b8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_b8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_b8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    if (local_b8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (NodeDef *)0x0) {
      local_e8._16_8_ = (element_type *)0x0;
      peStack_d0 = (element_type *)0x0;
    }
    else {
      trieste::NodeDef::clone
                ((NodeDef *)(local_e8 + 0x10),
                 (__fn *)local_b8.node.
                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 __child_stack_03,iVar13,in_R8);
    }
    local_1b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_e8._16_8_;
    local_1b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_d0;
    if (peStack_d0 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(((map<trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                     *)&peStack_d0->origin_)->_M_t)._M_impl.super__Rb_tree_header;
        (p_Var1->_M_header)._M_color = (p_Var1->_M_header)._M_color + _S_black;
        UNLOCK();
      }
      else {
        p_Var1 = &(((map<trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                     *)&peStack_d0->origin_)->_M_t)._M_impl.super__Rb_tree_header;
        (p_Var1->_M_header)._M_color = (p_Var1->_M_header)._M_color + _S_black;
      }
    }
    trieste::NodeDef::push_back((NodeDef *)uVar7,&local_1b0);
    if ((element_type *)
        local_1b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_1b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar7;
    local_1b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    if (this != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        psVar2 = &(this->origin_)._M_string_length;
        *(int *)psVar2 = (int)*psVar2 + 1;
        UNLOCK();
      }
      else {
        psVar2 = &(this->origin_)._M_string_length;
        *(int *)psVar2 = (int)*psVar2 + 1;
      }
    }
    trieste::NodeDef::push_back((NodeDef *)local_108._0_8_,&local_1b0);
    if ((element_type *)
        local_1b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    uVar8 = local_108._8_8_;
    uVar7 = local_108._0_8_;
    local_108._0_8_ = (NodeDef *)0x0;
    local_108._8_8_ = (element_type *)0x0;
    local_1b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*in_RDX;
    p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    local_1b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var14;
    trieste::NodeDef::push_back((NodeDef *)uVar7,&local_1b0);
    _Var15._M_pi = extraout_RDX_09;
    if (local_1b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var15._M_pi = extraout_RDX_10;
    }
    (fq->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)uVar7;
    (fq->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
      _Var15._M_pi = extraout_RDX_11;
    }
    p_Var14 = local_130;
    if (this != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
      _Var15._M_pi = extraout_RDX_12;
    }
    if (peStack_d0 != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_d0);
      _Var15._M_pi = extraout_RDX_13;
    }
    if (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
      _Var15._M_pi = extraout_RDX_14;
    }
    if (local_b8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var15._M_pi = extraout_RDX_15;
    }
    if ((NodeDef *)local_c8._8_8_ != (NodeDef *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
      _Var15._M_pi = extraout_RDX_16;
    }
    if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
      _Var15._M_pi = extraout_RDX_17;
    }
    if (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var15._M_pi = extraout_RDX_18;
    }
    if (local_78.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var15._M_pi = extraout_RDX_19;
    }
    if (peStack_140 != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_140);
      _Var15._M_pi = extraout_RDX_20;
    }
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
      _Var15._M_pi = extraout_RDX_21;
    }
    if (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var15._M_pi = extraout_RDX_22;
    }
    pNVar16 = (NodeDef *)local_108._8_8_;
    if (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var15._M_pi = extraout_RDX_23;
      pNVar16 = (NodeDef *)local_108._8_8_;
    }
  }
  else {
    iVar13 = 0x2dd288;
    if (*(undefined1 **)(*in_RDX + 0x10) == Selector) {
      local_1a0.wf = (Wellformed *)FQFunction;
      NVar17 = trieste::NodeDef::create((NodeDef *)(local_128 + 0x10),(Token *)&local_1a0);
      peVar5 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var14 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                ._M_pi;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
      }
      if (peVar5 == (element_type *)0x0) {
        local_e8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_e8._8_8_ = (element_type *)0x0;
      }
      else {
        trieste::NodeDef::clone
                  ((NodeDef *)local_e8,(__fn *)peVar5,
                   NVar17.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi,iVar13,in_R8);
      }
      local_1a0.wf = (Wellformed *)local_e8._0_8_;
      local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_e8._8_8_;
      if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8._8_8_ + 8))->_M_pi =
               *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8._8_8_ + 8))->_M_pi +
               1;
          UNLOCK();
        }
        else {
          *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8._8_8_ + 8))->_M_pi =
               *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8._8_8_ + 8))->_M_pi +
               1;
        }
      }
      trieste::NodeDef::push_back((NodeDef *)local_128._16_8_,(Node *)&local_1a0);
      if (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      pNVar16 = pNStack_110;
      uVar7 = local_128._16_8_;
      local_128._16_8_ = (NodeDef *)0x0;
      pNStack_110 = (NodeDef *)0x0;
      local_1a0.wf = (Wellformed *)*in_RDX;
      peVar5 = (element_type *)in_RDX[1];
      if (peVar5 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3 = &(peVar5->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                    super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
          UNLOCK();
        }
        else {
          p_Var3 = &(peVar5->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                    super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
        }
      }
      if (peVar5 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3 = &(peVar5->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                    super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
          UNLOCK();
        }
        else {
          p_Var3 = &(peVar5->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                    super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
        }
      }
      local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar5;
      trieste::NodeDef::push_back((NodeDef *)uVar7,(Node *)&local_1a0);
      _Var15._M_pi = extraout_RDX_24;
      if (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        _Var15._M_pi = extraout_RDX_25;
      }
      (fq->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)uVar7;
      (fq->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pNVar16;
      if (peVar5 != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5);
        _Var15._M_pi = extraout_RDX_26;
      }
      if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
        _Var15._M_pi = extraout_RDX_27;
      }
      pNVar16 = pNStack_110;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        _Var15._M_pi = extraout_RDX_28;
        pNVar16 = pNStack_110;
      }
    }
    else {
      local_1a0.wf = (Wellformed *)FQType;
      trieste::NodeDef::create((NodeDef *)local_128,(Token *)&local_1a0);
      local_78.wf = (Wellformed *)TypePath;
      trieste::operator/(&local_1a0,node,(Token *)&local_78);
      _Var6._M_pi = local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        local_158._0_8_ = (NodeDef *)0x0;
        local_158._8_8_ = (element_type *)0x0;
      }
      else {
        trieste::NodeDef::clone
                  ((NodeDef *)local_158,
                   (__fn *)local_1a0.node.
                           super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   __child_stack,iVar13,in_R8);
      }
      local_b8.wf = (Wellformed *)Type;
      trieste::operator/(&local_98,node,(Token *)(local_c8 + 0x10));
      _Var10._M_pi = local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      if (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        local_108._16_8_ = (TokenDef *)0x0;
        peStack_f0 = (element_type *)0x0;
      }
      else {
        trieste::NodeDef::clone
                  ((NodeDef *)(local_108 + 0x10),
                   (__fn *)local_98.node.
                           super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   __child_stack_01,iVar13,in_R8);
      }
      local_178.wf = (Wellformed *)local_108._16_8_;
      local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peStack_f0;
      if (peStack_f0 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3 = &(peStack_f0->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                    super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
          UNLOCK();
        }
        else {
          p_Var3 = &(peStack_f0->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                    super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
        }
      }
      trieste::NodeDef::push_back((NodeDef *)local_158._0_8_,(Node *)&local_178);
      if (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      uVar7 = local_158._8_8_;
      local_178.wf = (Wellformed *)local_158._0_8_;
      local_158._0_8_ = (NodeDef *)0x0;
      local_158._8_8_ = (element_type *)0x0;
      local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar7;
      if ((element_type *)uVar7 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(uVar7 + 8))->_M_pi =
               *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(uVar7 + 8))->_M_pi + 1;
          UNLOCK();
        }
        else {
          *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(uVar7 + 8))->_M_pi =
               *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(uVar7 + 8))->_M_pi + 1;
        }
      }
      trieste::NodeDef::push_back((NodeDef *)local_128._0_8_,(Node *)&local_178);
      if (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      uVar9 = local_128._8_8_;
      uVar8 = local_128._0_8_;
      local_128._0_8_ = (NodeDef *)0x0;
      local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_178.wf = (Wellformed *)*in_RDX;
      peVar5 = (element_type *)in_RDX[1];
      if (peVar5 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3 = &(peVar5->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                    super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
          UNLOCK();
        }
        else {
          p_Var3 = &(peVar5->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                    super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
        }
      }
      if (peVar5 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3 = &(peVar5->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                    super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
          UNLOCK();
        }
        else {
          p_Var3 = &(peVar5->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                    super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var3->_M_pi = *(int *)&p_Var3->_M_pi + 1;
        }
      }
      local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar5;
      trieste::NodeDef::push_back((NodeDef *)uVar8,(Node *)&local_178);
      _Var15._M_pi = extraout_RDX;
      if (local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_178.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        _Var15._M_pi = extraout_RDX_00;
      }
      (fq->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)uVar8;
      (fq->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
      if (peVar5 != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5);
        _Var15._M_pi = extraout_RDX_01;
      }
      if ((element_type *)uVar7 != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
        _Var15._M_pi = extraout_RDX_02;
      }
      if (peStack_f0 != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_f0);
        _Var15._M_pi = extraout_RDX_03;
      }
      if (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
        _Var15._M_pi = extraout_RDX_04;
      }
      if (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var15._M_pi = extraout_RDX_05;
      }
      if ((element_type *)local_158._8_8_ != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
        _Var15._M_pi = extraout_RDX_06;
      }
      if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
        _Var15._M_pi = extraout_RDX_07;
      }
      pNVar16 = (NodeDef *)local_128._8_8_;
      if (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1a0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var15._M_pi = extraout_RDX_08;
        pNVar16 = (NodeDef *)local_128._8_8_;
      }
    }
  }
  if (pNVar16 != (NodeDef *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pNVar16);
    _Var15._M_pi = extraout_RDX_29;
  }
  NVar17.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var15._M_pi;
  NVar17.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)fq;
  return (Node)NVar17.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node append_fq(Node fq, Node node)
  {
    assert(fq->type().in({FQType, FQFunction}));
    assert(node->in(
      {TypeClassName, TypeAliasName, TypeParamName, TypeTraitName, Selector}));

    if (fq == FQFunction)
    {
      // FQFunction + Selector = not allowed
      assert(node != Selector);

      // FQFunction + Type = FQType
      return FQType << (clone(fq / FQType / TypePath)
                        << clone(fq / FQType / Type) << clone(fq / Selector))
                    << node;
    }

    // FQType + Selector = FQFunction
    if (node == Selector)
      return FQFunction << clone(fq) << node;

    // FQType + Type = FQType
    return FQType << (clone(fq / TypePath) << clone(fq / Type)) << node;
  }